

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ClassType::handleExtends
          (ClassType *this,ExtendsClauseSyntax *extendsClause,ASTContext *context,
          function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  string_view arg_05;
  string_view arg_06;
  string_view arg_07;
  string_view arg_08;
  string_view arg_09;
  string_view arg_10;
  string_view name;
  SymbolMap *pSVar1;
  anon_class_24_3_01c1f166 *paVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  Type *pTVar6;
  SubroutineSymbol *pSVar7;
  TransparentMemberSymbol *pTVar8;
  ConstraintBlockSymbol *pCVar9;
  Scope *in_RDX;
  ClassType *in_RDI;
  Type *possibleBase;
  Diagnostic *diag_4;
  Diagnostic *diag_3;
  Diagnostic *diag_2;
  ConstraintBlockSymbol *baseConstraint;
  Symbol *found;
  ConstraintBlockSymbol *derived;
  ClassType *currentBase;
  bool isOverridden;
  SubroutineSymbol *protoSub;
  Symbol *baseSub;
  MethodPrototypeSymbol *proto;
  Symbol *member_1;
  iterator __end2_1;
  iterator __begin2_1;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *__range2_1;
  anon_class_24_3_01c1f166 checkForOverride;
  anon_class_8_1_bc11688f checkOverrideSpecifiers;
  TransparentMemberSymbol *wrapper;
  Diagnostic *diag_1;
  ConstraintBlockSymbol *cb;
  Diagnostic *diag;
  MethodPrototypeSymbol *sub;
  Symbol *toWrap;
  const_iterator it;
  Symbol *member;
  iterator __end2;
  iterator __begin2;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *__range2;
  bool pureVirtualError;
  SymbolMap *scopeNameMap;
  Type *next;
  ClassType *currBase;
  ClassType *baseType;
  Compilation *comp;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  Symbol *in_stack_fffffffffffffa78;
  undefined7 in_stack_fffffffffffffa80;
  undefined1 in_stack_fffffffffffffa87;
  SourceLocation in_stack_fffffffffffffa88;
  Scope *in_stack_fffffffffffffa90;
  SourceLocation in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  uint in_stack_fffffffffffffaa4;
  bitmask<slang::ast::ConstraintBlockFlags> *pbVar10;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  undefined8 in_stack_fffffffffffffab0;
  DiagCode DVar11;
  Diagnostic *in_stack_fffffffffffffac0;
  Scope *in_stack_fffffffffffffac8;
  SyntaxNode *in_stack_fffffffffffffad0;
  Scope *in_stack_fffffffffffffad8;
  bitmask<slang::ast::MethodFlags> *in_stack_fffffffffffffae0;
  SubroutineSymbol *in_stack_fffffffffffffae8;
  anon_class_24_3_01c1f166 *in_stack_fffffffffffffaf0;
  bool local_4e1;
  bool local_4d1;
  bitmask<slang::ast::ConstraintBlockFlags> local_481;
  Type *local_480;
  SourceLocation local_478;
  undefined4 local_46c;
  size_t local_468;
  char *local_460;
  SourceLocation local_458;
  undefined4 local_44c;
  Diagnostic *local_448;
  bitmask<slang::ast::ConstraintBlockFlags> local_439;
  SourceLocation local_438;
  undefined4 local_42c;
  size_t local_428;
  char *local_420;
  SourceLocation local_418;
  undefined4 local_40c;
  MethodPrototypeSymbol *in_stack_fffffffffffffbf8;
  bitmask<slang::ast::ConstraintBlockFlags> local_3f9;
  SourceLocation local_3f8;
  undefined4 local_3ec;
  SourceLocation local_3e8;
  undefined4 local_3dc;
  Diagnostic *local_3d8;
  bitmask<slang::ast::ConstraintBlockFlags> local_3cb;
  bitmask<slang::ast::ConstraintBlockFlags> local_3ca;
  bitmask<slang::ast::ConstraintBlockFlags> local_3c9;
  ConstraintBlockSymbol *local_3c8;
  size_t local_3c0;
  char *local_3b8;
  Symbol *local_3b0;
  ConstraintBlockSymbol *local_3a8;
  ClassType *local_3a0;
  byte local_391;
  SubroutineSymbol *local_390;
  Symbol *local_388;
  MethodPrototypeSymbol *local_380;
  Symbol *local_378;
  Symbol *local_370;
  Symbol *local_368;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  local_360;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *local_350;
  ClassType **local_348;
  Scope **local_340;
  Scope *local_338;
  Scope *local_330;
  TransparentMemberSymbol *local_328;
  SourceLocation local_320;
  undefined4 local_314;
  size_t local_310;
  char *local_308;
  size_t local_300;
  char *local_2f8;
  size_t local_2f0;
  char *local_2e8;
  SourceRange local_2e0;
  undefined4 local_2cc;
  Diagnostic *local_2c8;
  bitmask<slang::ast::ConstraintBlockFlags> local_2b9;
  ConstraintBlockSymbol *local_2b8;
  SourceLocation local_2b0;
  undefined4 local_2a4;
  size_t local_2a0;
  char *local_298;
  size_t local_290;
  char *in_stack_fffffffffffffd78;
  SubroutineSymbol *in_stack_fffffffffffffd80;
  SubroutineSymbol *in_stack_fffffffffffffd88;
  SourceRange in_stack_fffffffffffffd90;
  bitmask<slang::ast::MethodFlags> local_24a;
  MethodPrototypeSymbol *local_248;
  Symbol *local_240;
  const_iterator local_238;
  char_pointer local_228;
  table_element_pointer local_220;
  bitmask<slang::ast::MethodFlags> local_214;
  bitmask<slang::ast::MethodFlags> local_212;
  Symbol *local_210;
  Symbol *local_208;
  Symbol *local_200;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  local_1f8;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *local_1e8;
  byte local_1d9;
  SymbolMap *local_1d8;
  Type *local_1d0;
  ASTContext *in_stack_fffffffffffffe38;
  NameSyntax *in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe48 [16];
  ClassType *local_1a0;
  ClassType *local_138;
  Compilation *local_130;
  Scope *local_128;
  string_view *local_100;
  SymbolMap *local_f8;
  char_pointer local_f0;
  table_element_pointer local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  string_view *local_d0;
  SymbolMap *local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  local_b0;
  string_view *local_98;
  SymbolMap *local_90;
  iterator local_88;
  size_t local_78;
  anon_class_24_3_01c1f166 *local_70;
  SymbolMap *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  anon_class_24_3_01c1f166 *local_10;
  SymbolMap *local_8;
  
  local_128 = in_RDX;
  local_130 = ASTContext::getCompilation((ASTContext *)0x32ce5c);
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0x32ce75);
  std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)0x32ce9a);
  local_1a0 = Lookup::findClass(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                                (_Optional_base<slang::DiagCode,_true,_true>)
                                in_stack_fffffffffffffe48._2_6_);
  DVar11 = SUB84((ulong)in_stack_fffffffffffffab0 >> 0x20,0);
  local_138 = local_1a0;
  if (local_1a0 == (ClassType *)0x0) {
    pTVar6 = Compilation::getErrorType(local_130);
    in_RDI->baseClass = pTVar6;
  }
  else if ((local_1a0->isInterface & 1U) == 0) {
    if ((local_1a0->isFinal & 1U) == 0) {
      while (DVar11 = SUB84((ulong)in_stack_fffffffffffffab0 >> 0x20,0), local_1a0 != in_RDI) {
        local_1d0 = getBaseClass((ClassType *)
                                 CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
        if ((local_1d0 == (Type *)0x0) || (bVar3 = Type::isError((Type *)0x32d1c6), bVar3)) {
          in_RDI->baseClass = &local_138->super_Type;
          local_1d8 = Scope::getNameMap((Scope *)CONCAT17(in_stack_fffffffffffffa87,
                                                          in_stack_fffffffffffffa80));
          local_1d9 = 0;
          local_1f8 = Scope::members(in_stack_fffffffffffffa90);
          local_1e8 = &local_1f8;
          local_200 = (Symbol *)
                      std::ranges::
                      subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
                      ::begin(local_1e8);
          local_208 = (Symbol *)
                      std::ranges::
                      subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
                      ::end(local_1e8);
          goto LAB_0032d27b;
        }
        Type::getCanonicalType
                  ((Type *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
        local_1a0 = Symbol::as<slang::ast::ClassType>((Symbol *)0x32d1e3);
      }
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffad0);
      sourceRange_01.startLoc._4_4_ = in_stack_fffffffffffffaa4;
      sourceRange_01.startLoc._0_4_ = in_stack_fffffffffffffaa0;
      sourceRange_01.endLoc._0_4_ = in_stack_fffffffffffffaa8;
      sourceRange_01.endLoc._4_4_ = in_stack_fffffffffffffaac;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa98,DVar11,sourceRange_01);
      arg_01._M_str = (char *)in_stack_fffffffffffffad0;
      arg_01._M_len = (size_t)in_stack_fffffffffffffac8;
      Diagnostic::operator<<(in_stack_fffffffffffffac0,arg_01);
      pTVar6 = Compilation::getErrorType(local_130);
      in_RDI->baseClass = pTVar6;
    }
    else {
      pTVar6 = Compilation::getErrorType(local_130);
      in_RDI->baseClass = pTVar6;
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffad0);
      sourceRange_00.startLoc._4_4_ = in_stack_fffffffffffffaa4;
      sourceRange_00.startLoc._0_4_ = in_stack_fffffffffffffaa0;
      sourceRange_00.endLoc._0_4_ = in_stack_fffffffffffffaa8;
      sourceRange_00.endLoc._4_4_ = in_stack_fffffffffffffaac;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa98,DVar11,sourceRange_00);
      arg_00._M_str = (char *)in_stack_fffffffffffffad0;
      arg_00._M_len = (size_t)in_stack_fffffffffffffac8;
      Diagnostic::operator<<(in_stack_fffffffffffffac0,arg_00);
    }
  }
  else {
    pTVar6 = Compilation::getErrorType(local_130);
    in_RDI->baseClass = pTVar6;
    slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffad0);
    sourceRange.startLoc._4_4_ = in_stack_fffffffffffffaa4;
    sourceRange.startLoc._0_4_ = in_stack_fffffffffffffaa0;
    sourceRange.endLoc._0_4_ = in_stack_fffffffffffffaa8;
    sourceRange.endLoc._4_4_ = in_stack_fffffffffffffaac;
    ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa98,DVar11,sourceRange);
    arg._M_str = (char *)in_stack_fffffffffffffad0;
    arg._M_len = (size_t)in_stack_fffffffffffffac8;
    Diagnostic::operator<<(in_stack_fffffffffffffac0,arg);
  }
  return;
LAB_0032d27b:
  bVar3 = operator==<slang::ast::Scope::iterator>
                    ((self_type *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                     (iterator *)in_stack_fffffffffffffa78);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    local_330 = local_128;
    local_348 = &local_138;
    local_340 = &local_330;
    local_338 = local_128;
    local_360 = Scope::members(in_stack_fffffffffffffa90);
    local_350 = &local_360;
    local_368 = (Symbol *)
                std::ranges::
                subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
                ::begin(local_350);
    local_370 = (Symbol *)
                std::ranges::
                subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
                ::end(local_350);
    pbVar10 = (bitmask<slang::ast::ConstraintBlockFlags> *)
              ((ulong)in_stack_fffffffffffffaa4 << 0x20);
    do {
      bVar3 = operator==<slang::ast::Scope::iterator>
                        ((self_type *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                         (iterator *)in_stack_fffffffffffffa78);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        return;
      }
      local_378 = iterator_facade<slang::ast::Scope::iterator,_false>::operator*
                            ((iterator_facade<slang::ast::Scope::iterator,_false> *)0x32dced);
      if (local_378->kind == Subroutine) {
        Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x32dd0f);
        const::$_1::operator()(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      }
      else if (local_378->kind == MethodPrototype) {
        local_380 = Symbol::as<slang::ast::MethodPrototypeSymbol>((Symbol *)0x32dd42);
        const::$_1::operator()
                  (in_stack_fffffffffffffaf0,(MethodPrototypeSymbol *)in_stack_fffffffffffffae8);
        local_388 = MethodPrototypeSymbol::getOverride(local_380);
        if ((local_388 != (Symbol *)0x0) &&
           (local_390 = MethodPrototypeSymbol::getSubroutine(in_stack_fffffffffffffbf8),
           local_390 != (SubroutineSymbol *)0x0)) {
          in_stack_fffffffffffffac0 =
               (Diagnostic *)
               not_null<const_slang::ast::Scope_*>::operator*
                         ((not_null<const_slang::ast::Scope_*> *)0x32ddac);
          Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x32ddbe);
          SubroutineSymbol::checkVirtualMethodMatch
                    ((Scope *)in_stack_fffffffffffffd90.startLoc,in_stack_fffffffffffffd88,
                     in_stack_fffffffffffffd80,SUB81((ulong)in_stack_fffffffffffffd78 >> 0x38,0));
        }
      }
      else if (local_378->kind == ConstraintBlock) {
        local_391 = 0;
        local_3a0 = local_138;
        local_3a8 = Symbol::as<slang::ast::ConstraintBlockSymbol>((Symbol *)0x32de15);
        while( true ) {
          local_3c0 = (local_378->name)._M_len;
          local_3b8 = (local_378->name)._M_str;
          name._M_str = (char *)in_stack_fffffffffffffae8;
          name._M_len = (size_t)in_stack_fffffffffffffae0;
          local_3b0 = Scope::find(in_stack_fffffffffffffad8,name);
          if (local_3b0 != (Symbol *)0x0) break;
          local_480 = getBaseClass((ClassType *)
                                   CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
          if ((local_480 == (Type *)0x0) || (bVar3 = Type::isError((Type *)0x32e242), bVar3))
          goto LAB_0032e26c;
          Type::getCanonicalType
                    ((Type *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
          local_3a0 = Symbol::as<slang::ast::ClassType>((Symbol *)0x32e25f);
        }
        if (local_3b0->kind == ConstraintBlock) {
          local_391 = 1;
          local_3c8 = Symbol::as<slang::ast::ConstraintBlockSymbol>((Symbol *)0x32de9b);
          bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_3c9,Pure);
          bVar4 = bitmask<slang::ast::ConstraintBlockFlags>::has
                            ((bitmask<slang::ast::ConstraintBlockFlags> *)
                             CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                             (bitmask<slang::ast::ConstraintBlockFlags> *)in_stack_fffffffffffffa78)
          ;
          bVar3 = false;
          if (bVar4) {
            in_stack_fffffffffffffa98 = (SourceLocation)&local_3c8->flags;
            bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_3ca,Static);
            bVar3 = bitmask<slang::ast::ConstraintBlockFlags>::has
                              ((bitmask<slang::ast::ConstraintBlockFlags> *)
                               CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                               (bitmask<slang::ast::ConstraintBlockFlags> *)
                               in_stack_fffffffffffffa78);
            uVar5 = (uint)bVar3;
            pCVar9 = Symbol::as<slang::ast::ConstraintBlockSymbol>((Symbol *)0x32df39);
            pbVar10 = &pCVar9->flags;
            bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_3cb,Static);
            bVar3 = bitmask<slang::ast::ConstraintBlockFlags>::has
                              ((bitmask<slang::ast::ConstraintBlockFlags> *)
                               CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                               (bitmask<slang::ast::ConstraintBlockFlags> *)
                               in_stack_fffffffffffffa78);
            bVar3 = uVar5 != bVar3;
          }
          if (bVar3) {
            local_3dc = 0x790006;
            local_3e8 = local_378->location;
            local_3d8 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa90,
                                            SUB84((ulong)pbVar10 >> 0x20,0),
                                            in_stack_fffffffffffffa98);
            local_3ec = 0x50001;
            local_3f8 = local_3b0->location;
            Diagnostic::addNote((Diagnostic *)
                                CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                                SUB84((ulong)in_stack_fffffffffffffa90 >> 0x20,0),
                                in_stack_fffffffffffffa88);
          }
          in_stack_fffffffffffffa90 = (Scope *)&local_3a8->flags;
          bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_3f9,Initial);
          bVar3 = bitmask<slang::ast::ConstraintBlockFlags>::has
                            ((bitmask<slang::ast::ConstraintBlockFlags> *)
                             CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                             (bitmask<slang::ast::ConstraintBlockFlags> *)in_stack_fffffffffffffa78)
          ;
          if (bVar3) {
            local_40c = 0x920006;
            local_418 = (local_3a8->super_Symbol).location;
            in_stack_fffffffffffffbf8 =
                 (MethodPrototypeSymbol *)
                 ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa90,
                                     SUB84((ulong)pbVar10 >> 0x20,0),in_stack_fffffffffffffa98);
            local_428 = (local_3a8->super_Symbol).name._M_len;
            local_420 = (local_3a8->super_Symbol).name._M_str;
            arg_08._M_str = (char *)in_stack_fffffffffffffad0;
            arg_08._M_len = (size_t)in_stack_fffffffffffffac8;
            Diagnostic::operator<<(in_stack_fffffffffffffac0,arg_08);
            local_42c = 0x50001;
            local_438 = (local_3c8->super_Symbol).location;
            Diagnostic::addNote((Diagnostic *)
                                CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                                SUB84((ulong)in_stack_fffffffffffffa90 >> 0x20,0),
                                in_stack_fffffffffffffa88);
          }
          else {
            in_stack_fffffffffffffa88 = (SourceLocation)&local_3c8->flags;
            bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_439,Final);
            bVar3 = bitmask<slang::ast::ConstraintBlockFlags>::has
                              ((bitmask<slang::ast::ConstraintBlockFlags> *)
                               CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                               (bitmask<slang::ast::ConstraintBlockFlags> *)
                               in_stack_fffffffffffffa78);
            if (bVar3) {
              local_44c = 0x910006;
              local_458 = (local_3a8->super_Symbol).location;
              local_448 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa90,
                                              SUB84((ulong)pbVar10 >> 0x20,0),
                                              in_stack_fffffffffffffa98);
              local_468 = (local_3a8->super_Symbol).name._M_len;
              local_460 = (local_3a8->super_Symbol).name._M_str;
              arg_09._M_str = (char *)in_stack_fffffffffffffad0;
              arg_09._M_len = (size_t)in_stack_fffffffffffffac8;
              Diagnostic::operator<<(in_stack_fffffffffffffac0,arg_09);
              local_46c = 0x50001;
              local_478 = (local_3c8->super_Symbol).location;
              Diagnostic::addNote((Diagnostic *)
                                  CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                                  SUB84((ulong)in_stack_fffffffffffffa90 >> 0x20,0),
                                  in_stack_fffffffffffffa88);
            }
          }
        }
LAB_0032e26c:
        in_stack_fffffffffffffa87 = false;
        if ((local_391 & 1) == 0) {
          in_stack_fffffffffffffa78 = (Symbol *)&local_3a8->flags;
          bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_481,Extends);
          in_stack_fffffffffffffa87 =
               bitmask<slang::ast::ConstraintBlockFlags>::has
                         ((bitmask<slang::ast::ConstraintBlockFlags> *)
                          CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                          (bitmask<slang::ast::ConstraintBlockFlags> *)in_stack_fffffffffffffa78);
        }
        if ((bool)in_stack_fffffffffffffa87 != false) {
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa90,
                              SUB84((ulong)pbVar10 >> 0x20,0),in_stack_fffffffffffffa98);
          arg_10._M_str = (char *)in_stack_fffffffffffffad0;
          arg_10._M_len = (size_t)in_stack_fffffffffffffac8;
          Diagnostic::operator<<(in_stack_fffffffffffffac0,arg_10);
        }
      }
      iterator_facade<slang::ast::Scope::iterator,_false>::operator++<slang::ast::Scope::iterator>
                ((iterator_facade<slang::ast::Scope::iterator,_false> *)
                 CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
    } while( true );
  }
  local_210 = iterator_facade<slang::ast::Scope::iterator,_false>::operator*
                        ((iterator_facade<slang::ast::Scope::iterator,_false> *)0x32d2a8);
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_210->name);
  if (!bVar3) {
    local_4d1 = false;
    if (local_210->kind == Subroutine) {
      Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x32d2ef);
      bitmask<slang::ast::MethodFlags>::bitmask(&local_212,Constructor);
      local_4d1 = bitmask<slang::ast::MethodFlags>::has
                            ((bitmask<slang::ast::MethodFlags> *)
                             CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                             (bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffa78);
    }
    if (local_4d1 == false) {
      local_4e1 = false;
      if (local_210->kind == MethodPrototype) {
        Symbol::as<slang::ast::MethodPrototypeSymbol>((Symbol *)0x32d377);
        bitmask<slang::ast::MethodFlags>::bitmask(&local_214,Constructor);
        local_4e1 = bitmask<slang::ast::MethodFlags>::has
                              ((bitmask<slang::ast::MethodFlags> *)
                               CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                               (bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffa78);
      }
      pSVar1 = local_1d8;
      if (local_4e1 == false) {
        local_100 = &local_210->name;
        local_f8 = local_1d8;
        local_c8 = local_1d8;
        local_90 = local_1d8;
        local_68 = local_1d8;
        local_d0 = local_100;
        local_98 = local_100;
        local_70 = (anon_class_24_3_01c1f166 *)local_100;
        local_78 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                   ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                             ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                               *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              in_stack_fffffffffffffa78);
        paVar2 = local_70;
        local_18 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                   ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                                  (size_t)in_stack_fffffffffffffa78);
        local_8 = pSVar1;
        local_10 = paVar2;
        local_20 = local_78;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,local_18);
        do {
          local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          local_40 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                     ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                               *)0x32d53c);
          local_40 = local_40 + local_38;
          local_44 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_fffffffffffffa88,
                                CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
          if (local_44 != 0) {
            local_50 = boost::unordered::detail::foa::
                       table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                       ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                   *)0x32d58a);
            local_58 = local_50 + local_38 * 0xf;
            do {
              local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              in_stack_fffffffffffffae8 =
                   (SubroutineSymbol *)
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                           *)0x32d5dd);
              in_stack_fffffffffffffaf0 = local_10;
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
              ::
              key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>
                        ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                          *)0x32d60a);
              bVar3 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_fffffffffffffa98,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_fffffffffffffa90);
              if (bVar3) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
                goto LAB_0032d701;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          bVar3 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                             (size_t)in_stack_fffffffffffffa78);
          if (bVar3) {
            memset(&local_b0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
            ::table_locator(&local_b0);
            goto LAB_0032d701;
          }
          bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_30,
                             (pSVar1->table_).
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                             .arrays.groups_size_mask);
        } while (bVar3);
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
        ::table_locator(&local_b0);
LAB_0032d701:
        local_88 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                   ::make_iterator((locator *)0x32d70e);
        local_e0.pc_ = local_88.pc_;
        local_e0.p_ = local_88.p_;
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
        ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
        local_f0 = local_c0.pc_;
        local_e8 = local_c0.p_;
        local_228 = local_c0.pc_;
        local_220 = local_c0.p_;
        local_238 = boost::unordered::
                    unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                    ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                           *)0x32d7a0);
        bVar3 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                           (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_fffffffffffffa78);
        if (!bVar3) {
          local_240 = local_210;
          if (local_210->kind == TransparentMember) {
            pTVar8 = Symbol::as<slang::ast::TransparentMemberSymbol>((Symbol *)0x32d7fa);
            local_240 = pTVar8->wrapped;
          }
          if (((in_RDI->isAbstract & 1U) == 0) && (local_240->kind == MethodPrototype)) {
            local_248 = Symbol::as<slang::ast::MethodPrototypeSymbol>((Symbol *)0x32d839);
            in_stack_fffffffffffffae0 = &local_248->flags;
            bitmask<slang::ast::MethodFlags>::bitmask(&local_24a,Pure);
            bVar3 = bitmask<slang::ast::MethodFlags>::has
                              ((bitmask<slang::ast::MethodFlags> *)
                               CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                               (bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffa78);
            if (bVar3) {
              if ((local_1d9 & 1) == 0) {
                in_stack_fffffffffffffad8 = local_128;
                in_stack_fffffffffffffd90 =
                     slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffad0);
                sourceRange_02.startLoc._4_4_ = in_stack_fffffffffffffaa4;
                sourceRange_02.startLoc._0_4_ = in_stack_fffffffffffffaa0;
                sourceRange_02.endLoc._0_4_ = in_stack_fffffffffffffaa8;
                sourceRange_02.endLoc._4_4_ = in_stack_fffffffffffffaac;
                ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa98,
                                    SUB84((ulong)in_stack_fffffffffffffab0 >> 0x20,0),sourceRange_02
                                   );
                in_stack_fffffffffffffd80 =
                     (SubroutineSymbol *)(in_RDI->super_Type).super_Symbol.name._M_len;
                in_stack_fffffffffffffd88 =
                     (SubroutineSymbol *)(in_RDI->super_Type).super_Symbol.name._M_str;
                arg_02._M_str = (char *)in_stack_fffffffffffffad0;
                arg_02._M_len = (size_t)in_stack_fffffffffffffac8;
                Diagnostic::operator<<(in_stack_fffffffffffffac0,arg_02);
                local_290 = (local_138->super_Type).super_Symbol.name._M_len;
                in_stack_fffffffffffffd78 = (local_138->super_Type).super_Symbol.name._M_str;
                arg_03._M_str = (char *)in_stack_fffffffffffffad0;
                arg_03._M_len = (size_t)in_stack_fffffffffffffac8;
                Diagnostic::operator<<(in_stack_fffffffffffffac0,arg_03);
                local_2a0 = (local_248->super_Symbol).name._M_len;
                local_298 = (local_248->super_Symbol).name._M_str;
                arg_04._M_str = (char *)in_stack_fffffffffffffad0;
                arg_04._M_len = (size_t)in_stack_fffffffffffffac8;
                Diagnostic::operator<<(in_stack_fffffffffffffac0,arg_04);
                local_2a4 = 0x50001;
                local_2b0 = (local_248->super_Symbol).location;
                Diagnostic::addNote((Diagnostic *)
                                    CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                                    SUB84((ulong)in_stack_fffffffffffffa90 >> 0x20,0),
                                    in_stack_fffffffffffffa88);
                local_1d9 = 1;
              }
              goto LAB_0032dc13;
            }
          }
          if (((in_RDI->isAbstract & 1U) == 0) && (local_240->kind == ConstraintBlock)) {
            local_2b8 = Symbol::as<slang::ast::ConstraintBlockSymbol>((Symbol *)0x32da28);
            in_stack_fffffffffffffad0 = (SyntaxNode *)&local_2b8->flags;
            bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_2b9,Pure);
            bVar3 = bitmask<slang::ast::ConstraintBlockFlags>::has
                              ((bitmask<slang::ast::ConstraintBlockFlags> *)
                               CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                               (bitmask<slang::ast::ConstraintBlockFlags> *)
                               in_stack_fffffffffffffa78);
            if (bVar3) {
              if ((local_1d9 & 1) == 0) {
                local_2cc = 0x4c0006;
                in_stack_fffffffffffffac8 = local_128;
                local_2e0 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffad0);
                sourceRange_03.startLoc._4_4_ = in_stack_fffffffffffffaa4;
                sourceRange_03.startLoc._0_4_ = in_stack_fffffffffffffaa0;
                sourceRange_03.endLoc._0_4_ = in_stack_fffffffffffffaa8;
                sourceRange_03.endLoc._4_4_ = in_stack_fffffffffffffaac;
                local_2c8 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa98,
                                                SUB84((ulong)in_stack_fffffffffffffab0 >> 0x20,0),
                                                sourceRange_03);
                local_2f0 = (in_RDI->super_Type).super_Symbol.name._M_len;
                local_2e8 = (in_RDI->super_Type).super_Symbol.name._M_str;
                arg_05._M_str = (char *)in_stack_fffffffffffffad0;
                arg_05._M_len = (size_t)in_stack_fffffffffffffac8;
                Diagnostic::operator<<(in_stack_fffffffffffffac0,arg_05);
                local_300 = (local_138->super_Type).super_Symbol.name._M_len;
                local_2f8 = (local_138->super_Type).super_Symbol.name._M_str;
                arg_06._M_str = (char *)in_stack_fffffffffffffad0;
                arg_06._M_len = (size_t)in_stack_fffffffffffffac8;
                Diagnostic::operator<<(in_stack_fffffffffffffac0,arg_06);
                local_310 = (local_2b8->super_Symbol).name._M_len;
                local_308 = (local_2b8->super_Symbol).name._M_str;
                arg_07._M_str = (char *)in_stack_fffffffffffffad0;
                arg_07._M_len = (size_t)in_stack_fffffffffffffac8;
                Diagnostic::operator<<(in_stack_fffffffffffffac0,arg_07);
                local_314 = 0x50001;
                local_320 = (local_2b8->super_Symbol).location;
                Diagnostic::addNote((Diagnostic *)
                                    CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                                    SUB84((ulong)in_stack_fffffffffffffa90 >> 0x20,0),
                                    in_stack_fffffffffffffa88);
                local_1d9 = 1;
              }
              goto LAB_0032dc13;
            }
          }
          local_328 = BumpAllocator::
                      emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                                ((BumpAllocator *)
                                 CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                                 in_stack_fffffffffffffa78);
          function_ref<void_(const_slang::ast::Symbol_&)>::operator()
                    ((function_ref<void_(const_slang::ast::Symbol_&)> *)
                     CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                     in_stack_fffffffffffffa78);
        }
      }
      else {
        Symbol::as<slang::ast::MethodPrototypeSymbol>((Symbol *)0x32d3cd);
        pSVar7 = MethodPrototypeSymbol::getSubroutine(in_stack_fffffffffffffbf8);
        in_RDI->baseConstructor = &pSVar7->super_Symbol;
      }
    }
    else {
      in_RDI->baseConstructor = local_210;
    }
  }
LAB_0032dc13:
  iterator_facade<slang::ast::Scope::iterator,_false>::operator++<slang::ast::Scope::iterator>
            ((iterator_facade<slang::ast::Scope::iterator,_false> *)
             CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
  goto LAB_0032d27b;
}

Assistant:

void ClassType::handleExtends(const ExtendsClauseSyntax& extendsClause, const ASTContext& context,
                              function_ref<void(const Symbol&)> insertCB) const {
    auto& comp = context.getCompilation();
    auto baseType = Lookup::findClass(*extendsClause.baseName, context);
    if (!baseType) {
        baseClass = &comp.getErrorType();
        return;
    }

    // A normal class can't extend an interface class. This method won't be called
    // for an interface class, so we don't need to check that again here.
    if (baseType->isInterface) {
        baseClass = &comp.getErrorType();
        context.addDiag(diag::ExtendIfaceFromClass, extendsClause.sourceRange()) << baseType->name;
        return;
    }

    if (baseType->isFinal) {
        baseClass = &comp.getErrorType();
        context.addDiag(diag::ExtendFromFinal, extendsClause.sourceRange()) << baseType->name;
        return;
    }

    // Make sure there are no cycles in the inheritance chain.
    auto currBase = baseType;
    while (true) {
        if (currBase == this) {
            context.addDiag(diag::ClassInheritanceCycle, extendsClause.sourceRange()) << name;
            baseClass = &comp.getErrorType();
            return;
        }

        auto next = currBase->getBaseClass();
        if (!next || next->isError())
            break;

        currBase = &next->getCanonicalType().as<ClassType>();
    }

    // Assign this member before resolving anything below, because they
    // may try to check the base class of this type.
    baseClass = baseType;

    // Inherit all base class members that don't conflict with our declared symbols.
    auto& scopeNameMap = getNameMap();
    bool pureVirtualError = false;

    for (auto& member : baseType->members()) {
        if (member.name.empty())
            continue;

        // Don't inherit constructors.
        if (member.kind == SymbolKind::Subroutine &&
            member.as<SubroutineSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = &member;
            continue;
        }
        if (member.kind == SymbolKind::MethodPrototype &&
            member.as<MethodPrototypeSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = member.as<MethodPrototypeSymbol>().getSubroutine();
            continue;
        }

        // Don't inherit if the member is already overridden.
        if (auto it = scopeNameMap.find(member.name); it != scopeNameMap.end())
            continue;

        // If the symbol itself was already inherited, create a new wrapper around
        // it for our own scope.
        const Symbol* toWrap = &member;
        if (member.kind == SymbolKind::TransparentMember)
            toWrap = &member.as<TransparentMemberSymbol>().wrapped;

        // If this is a pure virtual method being inherited and we aren't ourselves
        // an abstract class, issue an error.
        if (!isAbstract && toWrap->kind == SymbolKind::MethodPrototype) {
            auto& sub = toWrap->as<MethodPrototypeSymbol>();
            if (sub.flags.has(MethodFlags::Pure)) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstract,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << sub.name;
                    diag.addNote(diag::NoteDeclarationHere, sub.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        if (!isAbstract && toWrap->kind == SymbolKind::ConstraintBlock) {
            auto& cb = toWrap->as<ConstraintBlockSymbol>();
            if (cb.flags.has(ConstraintBlockFlags::Pure)) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstractConstraint,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << cb.name;
                    diag.addNote(diag::NoteDeclarationHere, cb.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        // All symbols get inserted into the beginning of the scope using the
        // provided insertion callback. We insert them as TransparentMemberSymbols
        // so that we can trace a path back to the actual location they are declared.
        auto wrapper = comp.emplace<TransparentMemberSymbol>(*toWrap);
        insertCB(*wrapper);
    }

    auto checkOverrideSpecifiers = [&](auto& base, auto& derived) {
        if (derived.flags.has(MethodFlags::Initial) && base.isVirtual()) {
            auto& diag = context.addDiag(diag::OverridingInitial, derived.location);
            diag << derived.name;
            diag.addNote(diag::NoteDeclarationHere, base.location);
        }
        else if (base.flags.has(MethodFlags::Final)) {
            auto& diag = context.addDiag(diag::OverridingFinal, derived.location);
            diag << derived.name;
            diag.addNote(diag::NoteDeclarationHere, base.location);
        }
        else if (!base.isVirtual() && derived.flags.has(MethodFlags::Extends)) {
            context.addDiag(diag::OverridingExtends, derived.location) << derived.name;
        }
    };

    auto checkForOverride = [&](auto& member) {
        // Constructors and static methods can never be virtual.
        if (member.flags.has(MethodFlags::Constructor | MethodFlags::Static))
            return;

        // Look in the parent class for a method with the same name.
        auto currentBase = baseType;
        while (true) {
            const Symbol* found = currentBase->find(member.name);
            if (found) {
                if (found->kind == SymbolKind::Subroutine) {
                    auto& baseSub = found->as<SubroutineSymbol>();
                    checkOverrideSpecifiers(baseSub, member);
                    if (baseSub.isVirtual())
                        member.setOverride(baseSub);
                    return;
                }
                break;
            }

            // Otherwise it could be inherited from a higher-level base.
            auto possibleBase = currentBase->getBaseClass();
            if (!possibleBase)
                break;

            if (possibleBase->isError())
                return;

            currentBase = &possibleBase->getCanonicalType().as<ClassType>();
        }

        // No base method found; if our member is marked 'extends' it's an error.
        if (member.flags.has(MethodFlags::Extends))
            context.addDiag(diag::OverridingExtends, member.location) << member.name;
    };

    // Check all methods in our class for overriding virtual methods in parent classes.
    for (auto& member : members()) {
        if (member.kind == SymbolKind::Subroutine) {
            checkForOverride(member.as<SubroutineSymbol>());
        }
        else if (member.kind == SymbolKind::MethodPrototype) {
            auto& proto = member.as<MethodPrototypeSymbol>();
            checkForOverride(proto);

            if (auto baseSub = proto.getOverride()) {
                if (auto protoSub = proto.getSubroutine()) {
                    SubroutineSymbol::checkVirtualMethodMatch(*context.scope,
                                                              baseSub->as<SubroutineSymbol>(),
                                                              *protoSub,
                                                              /* allowDerivedReturn */ true);
                }
            }
        }
        else if (member.kind == SymbolKind::ConstraintBlock) {
            // Constraint blocks can also be overridden -- check that 'static'ness
            // matches between base and derived if the base is pure.
            bool isOverridden = false;
            auto currentBase = baseType;
            auto& derived = member.as<ConstraintBlockSymbol>();
            while (true) {
                const Symbol* found = currentBase->find(member.name);
                if (found) {
                    if (found->kind == SymbolKind::ConstraintBlock) {
                        isOverridden = true;
                        auto& baseConstraint = found->as<ConstraintBlockSymbol>();
                        if (baseConstraint.flags.has(ConstraintBlockFlags::Pure) &&
                            baseConstraint.flags.has(ConstraintBlockFlags::Static) !=
                                member.as<ConstraintBlockSymbol>().flags.has(
                                    ConstraintBlockFlags::Static)) {
                            auto& diag = context.addDiag(diag::MismatchStaticConstraint,
                                                         member.location);
                            diag.addNote(diag::NoteDeclarationHere, found->location);
                        }

                        if (derived.flags.has(ConstraintBlockFlags::Initial)) {
                            auto& diag = context.addDiag(diag::OverridingInitial, derived.location);
                            diag << derived.name;
                            diag.addNote(diag::NoteDeclarationHere, baseConstraint.location);
                        }
                        else if (baseConstraint.flags.has(ConstraintBlockFlags::Final)) {
                            auto& diag = context.addDiag(diag::OverridingFinal, derived.location);
                            diag << derived.name;
                            diag.addNote(diag::NoteDeclarationHere, baseConstraint.location);
                        }
                    }
                    break;
                }

                // Otherwise it could be inherited from a higher-level base.
                auto possibleBase = currentBase->getBaseClass();
                if (!possibleBase || possibleBase->isError())
                    break;

                currentBase = &possibleBase->getCanonicalType().as<ClassType>();
            }

            if (!isOverridden && derived.flags.has(ConstraintBlockFlags::Extends))
                context.addDiag(diag::OverridingExtends, member.location) << member.name;
        }
    }
}